

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_checkstack(lua_State *L,int n)

{
  CallInfo *pCVar1;
  int iVar2;
  
  pCVar1 = L->ci;
  iVar2 = 1;
  if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)n) {
    iVar2 = luaD_growstack(L,n,0);
  }
  if ((iVar2 != 0) && ((pCVar1->top).p < (L->top).p + n)) {
    (pCVar1->top).p = (L->top).p + n;
  }
  return iVar2;
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int n) {
  int res;
  CallInfo *ci;
  lua_lock(L);
  ci = L->ci;
  api_check(L, n >= 0, "negative 'n'");
  if (L->stack_last.p - L->top.p > n)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else  /* need to grow stack */
    res = luaD_growstack(L, n, 0);
  if (res && ci->top.p < L->top.p + n)
    ci->top.p = L->top.p + n;  /* adjust frame top */
  lua_unlock(L);
  return res;
}